

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetPanId
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t aPanId,MilliSeconds aDelay)

{
  bool bVar1;
  uint uVar2;
  rep rVar3;
  element_type *peVar4;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  string_view fmt;
  ErrorCode local_244;
  Error local_240;
  anon_class_1_0_00000001 local_212;
  v10 local_211;
  v10 *local_210;
  size_t local_208;
  string local_200;
  Error local_1e0;
  undefined1 local_1a8 [8];
  PendingOperationalDataset pendingDataset;
  uint16_t aPanId_local;
  CommissionerApp *this_local;
  MilliSeconds aDelay_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  pendingDataset.mPendingTimestamp._5_1_ = 0;
  pendingDataset.mPendingTimestamp._6_2_ = aPanId;
  this_local = (CommissionerApp *)aDelay.__r;
  aDelay_local.__r = (rep)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)local_1a8);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    SetPanId::anon_class_1_0_00000001::operator()(&local_212);
    local_58 = &local_210;
    local_60 = &local_211;
    bVar5 = ::fmt::v10::operator()(local_60);
    local_208 = bVar5.size_;
    local_210 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_200;
    local_78 = local_210;
    sStack_70 = local_208;
    local_50 = &local_78;
    local_88 = local_210;
    local_80 = local_208;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_200,local_88,fmt,args);
    Error::Error(&local_1e0,kInvalidState,&local_200);
    Error::operator=(__return_storage_ptr__,&local_1e0);
    Error::~Error(&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
  }
  else {
    pendingDataset.super_ActiveOperationalDataset.mExtendedPanId.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ = pendingDataset.mPendingTimestamp._6_2_;
    pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ =
         (ushort)pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage | 0x100;
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
    pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)rVar3;
    pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ =
         (ushort)pendingDataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage | 0x20;
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar4->_vptr_Commissioner[0x22])(&local_240,peVar4,local_1a8);
    aError = Error::operator=(__return_storage_ptr__,&local_240);
    local_244 = kNone;
    bVar1 = commissioner::operator!=(aError,&local_244);
    Error::~Error(&local_240);
    if (!bVar1) {
      MergeDataset(&this->mPendingDataset,(PendingOperationalDataset *)local_1a8);
    }
  }
  pendingDataset.mPendingTimestamp._5_1_ = 1;
  PendingOperationalDataset::~PendingOperationalDataset((PendingOperationalDataset *)local_1a8);
  if ((pendingDataset.mPendingTimestamp._5_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetPanId(uint16_t aPanId, MilliSeconds aDelay)
{
    Error                     error;
    PendingOperationalDataset pendingDataset;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    pendingDataset.mPanId = aPanId;
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kPanIdBit;

    pendingDataset.mDelayTimer = aDelay.count();
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;

    SuccessOrExit(error = mCommissioner->SetPendingDataset(pendingDataset));

    MergeDataset(mPendingDataset, pendingDataset);

exit:
    return error;
}